

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_process_metric_2hoptlv(nhdp_domain *domain,nhdp_l2hop *l2hop,uint8_t *value)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t metric;
  nhdp_l2hop_domaindata *data;
  uint8_t *puStack_50;
  rfc7181_metric_field metric_field;
  uint8_t *value_local;
  nhdp_l2hop *l2hop_local;
  nhdp_domain *domain_local;
  
  data._6_2_ = *(ushort *)value;
  puStack_50 = value;
  uVar2 = rfc7181_metric_decode((rfc7181_metric_field *)((long)&data + 6));
  iVar1 = domain->index;
  if ((data._6_2_ & 0x20) != 0) {
    l2hop->_domaindata[iVar1].metric.in = uVar2;
  }
  if ((data._6_2_ & 0x10) != 0) {
    l2hop->_domaindata[iVar1].metric.out = uVar2;
  }
  return;
}

Assistant:

void
nhdp_domain_process_metric_2hoptlv(struct nhdp_domain *domain, struct nhdp_l2hop *l2hop, const uint8_t *value) {
  struct rfc7181_metric_field metric_field;
  struct nhdp_l2hop_domaindata *data;
  uint32_t metric;

  memcpy(&metric_field, value, sizeof(metric_field));
  metric = rfc7181_metric_decode(&metric_field);

  data = nhdp_domain_get_l2hopdata(domain, l2hop);
  if (rfc7181_metric_has_flag(&metric_field, RFC7181_LINKMETRIC_INCOMING_NEIGH)) {
    data->metric.in = metric;
  }
  if (rfc7181_metric_has_flag(&metric_field, RFC7181_LINKMETRIC_OUTGOING_NEIGH)) {
    data->metric.out = metric;
  }
}